

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.h
# Opt level: O3

void __thiscall cmCMakePresetsGraph::TestPreset::TestPreset(TestPreset *this,TestPreset *param_1)

{
  pointer pcVar1;
  
  Preset::Preset(&this->super_Preset,&param_1->super_Preset);
  (this->super_Preset)._vptr_Preset = (_func_int **)&PTR__TestPreset_00bbaf88;
  (this->ConfigurePreset)._M_dataplus._M_p = (pointer)&(this->ConfigurePreset).field_2;
  pcVar1 = (param_1->ConfigurePreset)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->ConfigurePreset,pcVar1,
             pcVar1 + (param_1->ConfigurePreset)._M_string_length);
  (this->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool> =
       (param_1->InheritConfigureEnvironment).super__Optional_base<bool,_true,_true>._M_payload.
       super__Optional_payload_base<bool>;
  (this->Configuration)._M_dataplus._M_p = (pointer)&(this->Configuration).field_2;
  pcVar1 = (param_1->Configuration)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Configuration,pcVar1,
             pcVar1 + (param_1->Configuration)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->OverwriteConfigurationFile,&param_1->OverwriteConfigurationFile);
  (this->Output).super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>.
  _M_payload.
  super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>.
  super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>._M_engaged = false;
  if ((param_1->Output).
      super__Optional_base<cmCMakePresetsGraph::TestPreset::OutputOptions,_false,_false>._M_payload.
      super__Optional_payload<cmCMakePresetsGraph::TestPreset::OutputOptions,_true,_false,_false>.
      super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>._M_engaged ==
      true) {
    std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions>::
    _M_construct<cmCMakePresetsGraph::TestPreset::OutputOptions_const&>
              ((_Optional_payload_base<cmCMakePresetsGraph::TestPreset::OutputOptions> *)
               &this->Output,(OutputOptions *)&param_1->Output);
  }
  (this->Filter).super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>.
  _M_payload.
  super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>.
  super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>._M_engaged = false;
  if ((param_1->Filter).
      super__Optional_base<cmCMakePresetsGraph::TestPreset::FilterOptions,_false,_false>._M_payload.
      super__Optional_payload<cmCMakePresetsGraph::TestPreset::FilterOptions,_true,_false,_false>.
      super__Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>._M_engaged ==
      true) {
    std::_Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions>::
    _M_construct<cmCMakePresetsGraph::TestPreset::FilterOptions_const&>
              ((_Optional_payload_base<cmCMakePresetsGraph::TestPreset::FilterOptions> *)
               &this->Filter,(FilterOptions *)&param_1->Filter);
  }
  std::_Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>::
  _Optional_base(&(this->Execution).
                  super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                 ,&(param_1->Execution).
                   super__Optional_base<cmCMakePresetsGraph::TestPreset::ExecutionOptions,_false,_false>
                );
  return;
}

Assistant:

TestPreset(const TestPreset& /*other*/) = default;